

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char (*value) [6])

{
  Message *in_stack_ffffffffffffffd0;
  Message local_20;
  char (*value_local) [6];
  AssertionResult *this_local;
  
  Message::Message(in_stack_ffffffffffffffd0);
  Message::operator<<(&local_20,value);
  AppendMessage(this,(Message *)value);
  Message::~Message((Message *)0x174bb0);
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }